

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O3

int qpdfjob_initialize_from_wide_argv(qpdfjob_handle j,wchar_t **argv)

{
  long lVar1;
  int iVar2;
  long lVar3;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (*argv == (wchar_t *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (argv[lVar1] != (wchar_t *)0x0);
  }
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<int_(int,_const_char_*const_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:72:52)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<int_(int,_const_char_*const_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:72:52)>
             ::_M_manager;
  local_28._M_unused._M_object = j;
  iVar2 = QUtil::call_main_from_wmain
                    ((int)lVar3,argv,(function<int_(int,_const_char_*const_*)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return iVar2;
}

Assistant:

int
qpdfjob_initialize_from_wide_argv(qpdfjob_handle j, wchar_t const* const argv[])
{
    int argc = 0;
    for (auto k = argv; *k; ++k) {
        ++argc;
    }
    return QUtil::call_main_from_wmain(argc, argv, [j](int, char const* const new_argv[]) {
        return qpdfjob_initialize_from_argv(j, new_argv);
    });
}